

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::KcpConnection::forceClose(KcpConnection *this)

{
  EventLoop *this_00;
  _Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()> local_70;
  Functor local_50;
  undefined1 local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  if ((this->m_state < (kConnected|kDelayDisconnecting)) &&
     ((0x1aU >> (this->m_state & 0x1f) & 1) != 0)) {
    this->m_state = kDisconnecting;
    this_00 = this->m_loop;
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_30,
               (__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_70._M_f = (offset_in_KcpConnection_to_subr)forceCloseInLoop;
    local_70._8_8_ = 0;
    local_70._M_bound_args.super__Tuple_impl<0UL,_std::shared_ptr<sznet::net::KcpConnection>_>.
    super__Head_base<0UL,_std::shared_ptr<sznet::net::KcpConnection>,_false>._M_head_impl.
    super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_30;
    local_70._M_bound_args.super__Tuple_impl<0UL,_std::shared_ptr<sznet::net::KcpConnection>_>.
    super__Head_base<0UL,_std::shared_ptr<sznet::net::KcpConnection>,_false>._M_head_impl.
    super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_28._M_pi;
    _local_30 = ZEXT816(0) << 0x20;
    std::function<void()>::
    function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>,void>
              ((function<void()> *)&local_50,&local_70);
    EventLoop::queueInLoop(this_00,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_70._M_bound_args.
                       super__Tuple_impl<0UL,_std::shared_ptr<sznet::net::KcpConnection>_>.
                       super__Head_base<0UL,_std::shared_ptr<sznet::net::KcpConnection>,_false>.
                       _M_head_impl.
                       super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> + 8
               ));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  }
  return;
}

Assistant:

void KcpConnection::forceClose()
{
	// FIXME: use compare and swap
	if (m_state == kConnected || m_state == kConnecting || m_state == kDelayDisconnecting)
	{
		setState(kDisconnecting);
		m_loop->queueInLoop(std::bind(&KcpConnection::forceCloseInLoop, shared_from_this()));
	}
}